

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void game::userTurn(Game *game)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  int local_18;
  bool flag_all;
  bool flag_j;
  int iStack_14;
  bool flag_i;
  int j;
  int i;
  Game *game_local;
  
  iStack_14 = 0;
  bVar2 = true;
  bVar3 = true;
  bVar1 = true;
  _j = game;
  while (bVar1) {
    while (bVar2) {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar4,"X:  ");
      std::istream::operator>>((istream *)&std::cin,&stack0xffffffffffffffec);
      if ((iStack_14 < 0) || (2 < iStack_14)) {
        poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_20e9);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar2 = false;
      }
    }
    while (bVar3) {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar4,"Y:  ");
      std::istream::operator>>((istream *)&std::cin,&local_18);
      if ((local_18 < 0) || (2 < local_18)) {
        poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2109);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar3 = false;
      }
    }
    if (_j->bord[iStack_14][local_18] == ' ') {
      bVar1 = false;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2113);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      bVar2 = true;
      bVar3 = true;
    }
  }
  _j->bord[iStack_14][local_18] = _j->userChar;
  return;
}

Assistant:

void userTurn(Game *game){
        int i = 0,j;
        bool flag_i = true, flag_j = true, flag_all = true;
        while (flag_all) {
            while (flag_i) {
                std::cout << std::endl << "X:  ";
                std::cin >> i;
                if ((i < 0) || (i > 2)) {
                    std::cout << "Введите x корректно" << std::endl;
                } else {
                    flag_i = false;
                }
            }

            while (flag_j) {
                std::cout << std::endl << "Y:  ";
                std::cin >> j;
                if ((j < 0) || (j > 2)) {
                    std::cout << "Введите y корректно" << std::endl;
                } else {
                    flag_j = false;
                }
            }
            if (game->bord[i][j] == ' '){
                flag_all = false;
            }else{
                std::cout << "Не жульничайте" << std::endl;
                flag_i = true;
                flag_j = true;
            }
        }
        game->bord[i][j] = game->userChar;
    }